

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O0

string * __thiscall BamTools::Internal::HostInfo::GetErrorString_abi_cxx11_(HostInfo *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x40));
  return in_RDI;
}

Assistant:

std::string HostInfo::GetErrorString() const
{
    return m_errorString;
}